

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

nng_err nni_aio_sys_init(nng_init_params *params)

{
  short sVar1;
  nni_aio_expire_q *pnVar2;
  nni_aio_expire_q *eq;
  int i;
  int16_t max_thr;
  int16_t num_thr;
  nng_init_params *params_local;
  
  sVar1 = params->max_expire_threads;
  eq._6_2_ = params->num_expire_threads;
  if ((0 < sVar1) && (sVar1 < eq._6_2_)) {
    eq._6_2_ = sVar1;
  }
  if (eq._6_2_ < 1) {
    eq._6_2_ = 1;
  }
  params->num_expire_threads = eq._6_2_;
  nni_aio_expire_q_list = (nni_aio_expire_q **)nni_zalloc((long)eq._6_2_ << 3);
  nni_aio_expire_q_cnt = (int)eq._6_2_;
  eq._0_4_ = 0;
  while( true ) {
    if (eq._6_2_ <= (int)eq) {
      return NNG_OK;
    }
    pnVar2 = nni_aio_expire_q_alloc();
    if (pnVar2 == (nni_aio_expire_q *)0x0) break;
    nni_aio_expire_q_list[(int)eq] = pnVar2;
    eq._0_4_ = (int)eq + 1;
  }
  nni_aio_sys_fini();
  return NNG_ENOMEM;
}

Assistant:

nng_err
nni_aio_sys_init(nng_init_params *params)
{
	int16_t num_thr;
	int16_t max_thr;

	max_thr = params->max_expire_threads;
	num_thr = params->num_expire_threads;

	if ((max_thr > 0) && (num_thr > max_thr)) {
		num_thr = max_thr;
	}
	if (num_thr < 1) {
		num_thr = 1;
	}
	params->num_expire_threads = num_thr;
	nni_aio_expire_q_list =
	    nni_zalloc(sizeof(nni_aio_expire_q *) * num_thr);
	nni_aio_expire_q_cnt = num_thr;
	for (int i = 0; i < num_thr; i++) {
		nni_aio_expire_q *eq;
		if ((eq = nni_aio_expire_q_alloc()) == NULL) {
			nni_aio_sys_fini();
			return (NNG_ENOMEM);
		}
		nni_aio_expire_q_list[i] = eq;
	}

	return (NNG_OK);
}